

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

pair<slang::parsing::Trivia,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handleMacroUsage(Preprocessor *this,Token directive)

{
  MacroUsageSyntax *syntax_00;
  Trivia *in_RSI;
  pair<slang::parsing::Trivia,_slang::parsing::Trivia> *in_RDI;
  MacroUsageSyntax *syntax;
  type *extraTrivia;
  type *actualArgs;
  Preprocessor *in_stack_00000648;
  Token in_stack_00000650;
  Trivia *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff98;
  BumpAllocator *in_stack_ffffffffffffffa0;
  
  *(undefined1 *)((long)&in_RSI[0x1f].field_0 + 8) = 1;
  handleTopLevelMacro(in_stack_00000648,in_stack_00000650);
  std::get<0ul,slang::syntax::MacroActualArgumentListSyntax*,slang::parsing::Trivia>
            ((pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia> *)
             0x51ba39);
  std::get<1ul,slang::syntax::MacroActualArgumentListSyntax*,slang::parsing::Trivia>
            ((pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia> *)
             0x51ba48);
  *(undefined1 *)((long)&in_RSI[0x1f].field_0 + 8) = 0;
  syntax_00 = BumpAllocator::
              emplace<slang::syntax::MacroUsageSyntax,slang::parsing::Token&,slang::syntax::MacroActualArgumentListSyntax*&>
                        (in_stack_ffffffffffffffa0,(Token *)in_stack_ffffffffffffff98,
                         (MacroActualArgumentListSyntax **)in_RDI);
  Trivia::Trivia((Trivia *)&stack0xffffffffffffff98,Directive,(SyntaxNode *)syntax_00);
  std::make_pair<slang::parsing::Trivia,slang::parsing::Trivia&>(in_RSI,in_stack_ffffffffffffff78);
  return in_RDI;
}

Assistant:

std::pair<Trivia, Trivia> Preprocessor::handleMacroUsage(Token directive) {
    // delegate to a nested function to simplify the error handling paths
    inMacroBody = true;
    auto [actualArgs, extraTrivia] = handleTopLevelMacro(directive);
    inMacroBody = false;

    auto syntax = alloc.emplace<MacroUsageSyntax>(directive, actualArgs);
    return std::make_pair(Trivia(TriviaKind::Directive, syntax), extraTrivia);
}